

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gal2cirs.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  double date_00;
  CESkyCoord cirs_coord;
  CESkyCoord gal_coord;
  CEDate date;
  CEExecOptions opts;
  allocator local_3da;
  allocator local_3d9;
  CEAngle local_3d8;
  CEAngle local_3c8;
  CESkyCoordType local_3b4;
  CESkyCoord local_3b0;
  CESkyCoord local_380;
  double local_350;
  double local_348;
  CEObserver local_340;
  CEDate local_290;
  CEExecOptions local_250;
  
  DefineOpts();
  bVar1 = CLOptions::ParseCommandLine(&local_250.super_CLOptions,argc,argv);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_340,"juliandate",(allocator *)&local_380);
    date_00 = CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_340);
    CEDate::CEDate(&local_290,date_00,JD);
    std::__cxx11::string::~string((string *)&local_340);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_380);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_340,"glon",&local_3d9);
    local_348 = CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_340);
    CEAngle::Deg(&local_3c8,&local_348);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b0,"glat",&local_3da);
    local_350 = CLOptions::AsDouble(&local_250.super_CLOptions,(string *)&local_3b0);
    CEAngle::Deg(&local_3d8,&local_350);
    local_3b4 = GALACTIC;
    CESkyCoord::CESkyCoord(&local_380,&local_3c8,&local_3d8,&local_3b4);
    CEAngle::~CEAngle(&local_3d8);
    std::__cxx11::string::~string((string *)&local_3b0);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3da);
    CEAngle::~CEAngle(&local_3c8);
    std::__cxx11::string::~string((string *)&local_340);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_3d9);
    CEObserver::CEObserver(&local_340);
    CESkyCoord::ConvertToCIRS(&local_3b0,&local_380,&local_290,&local_340);
    CEObserver::~CEObserver(&local_340);
    PrintResults(&local_250,&local_3b0);
    CESkyCoord::~CESkyCoord(&local_3b0);
    CESkyCoord::~CESkyCoord(&local_380);
    CEDate::~CEDate(&local_290);
  }
  CEExecOptions::~CEExecOptions(&local_250);
  return 0;
}

Assistant:

int main(int argc, char** argv) 
{
    // Get the options from the command line
    CEExecOptions opts = DefineOpts() ;
    if (opts.ParseCommandLine(argc, argv)) return 0 ;
    
    // Convert the coordinates
    CEDate date(opts.AsDouble("juliandate"), CEDateType::JD);
    CESkyCoord gal_coord(CEAngle::Deg(opts.AsDouble("glon")),
                         CEAngle::Deg(opts.AsDouble("glat")),
                         CESkyCoordType::GALACTIC);
    CESkyCoord cirs_coord = gal_coord.ConvertToCIRS(date);
    
    // Print the results
    PrintResults(opts, cirs_coord) ;
    
    return 0 ;
}